

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nap_comm_struct.hpp
# Opt level: O1

void __thiscall NAPComm::NAPComm(NAPComm *this,topo_data *_topo_info)

{
  comm_pkg *pcVar1;
  comm_data *pcVar2;
  
  this->buffer_size = 0;
  this->send_requests = (MPI_Request *)0x0;
  this->recv_requests = (MPI_Request *)0x0;
  pcVar1 = (comm_pkg *)operator_new(0x10);
  pcVar2 = (comm_data *)operator_new(0x20);
  pcVar2->indptr = (int *)0x0;
  pcVar2->indices = (int *)0x0;
  pcVar2->num_msgs = 0;
  pcVar2->size_msgs = 0;
  pcVar2->procs = (int *)0x0;
  pcVar1->send_data = pcVar2;
  pcVar2 = (comm_data *)operator_new(0x20);
  pcVar2->indptr = (int *)0x0;
  pcVar2->indices = (int *)0x0;
  pcVar2->num_msgs = 0;
  pcVar2->size_msgs = 0;
  pcVar2->procs = (int *)0x0;
  pcVar1->recv_data = pcVar2;
  this->local_L_comm = pcVar1;
  pcVar1 = (comm_pkg *)operator_new(0x10);
  pcVar2 = (comm_data *)operator_new(0x20);
  pcVar2->indptr = (int *)0x0;
  pcVar2->indices = (int *)0x0;
  pcVar2->num_msgs = 0;
  pcVar2->size_msgs = 0;
  pcVar2->procs = (int *)0x0;
  pcVar1->send_data = pcVar2;
  pcVar2 = (comm_data *)operator_new(0x20);
  pcVar2->indptr = (int *)0x0;
  pcVar2->indices = (int *)0x0;
  pcVar2->num_msgs = 0;
  pcVar2->size_msgs = 0;
  pcVar2->procs = (int *)0x0;
  pcVar1->recv_data = pcVar2;
  this->local_R_comm = pcVar1;
  pcVar1 = (comm_pkg *)operator_new(0x10);
  pcVar2 = (comm_data *)operator_new(0x20);
  pcVar2->indptr = (int *)0x0;
  pcVar2->indices = (int *)0x0;
  pcVar2->num_msgs = 0;
  pcVar2->size_msgs = 0;
  pcVar2->procs = (int *)0x0;
  pcVar1->send_data = pcVar2;
  pcVar2 = (comm_data *)operator_new(0x20);
  pcVar2->indptr = (int *)0x0;
  pcVar2->indices = (int *)0x0;
  pcVar2->num_msgs = 0;
  pcVar2->size_msgs = 0;
  pcVar2->procs = (int *)0x0;
  pcVar1->recv_data = pcVar2;
  this->local_S_comm = pcVar1;
  pcVar1 = (comm_pkg *)operator_new(0x10);
  pcVar2 = (comm_data *)operator_new(0x20);
  pcVar2->indptr = (int *)0x0;
  pcVar2->indices = (int *)0x0;
  pcVar2->num_msgs = 0;
  pcVar2->size_msgs = 0;
  pcVar2->procs = (int *)0x0;
  pcVar1->send_data = pcVar2;
  pcVar2 = (comm_data *)operator_new(0x20);
  pcVar2->indptr = (int *)0x0;
  pcVar2->indices = (int *)0x0;
  pcVar2->num_msgs = 0;
  pcVar2->size_msgs = 0;
  pcVar2->procs = (int *)0x0;
  pcVar1->recv_data = pcVar2;
  this->global_comm = pcVar1;
  this->topo_info = _topo_info;
  return;
}

Assistant:

NAPComm(topo_data* _topo_info)
    {
        buffer_size = 0;
        send_requests = NULL;
        recv_requests = NULL;
        local_L_comm = new comm_pkg();
        local_R_comm = new comm_pkg();
        local_S_comm = new comm_pkg();
        global_comm = new comm_pkg();
        topo_info = _topo_info;
    }